

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,char *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char *args_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char (*args_3) [4],int *args_4,char *args_5,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_368;
  cmAlphaNum local_330;
  cmAlphaNum local_2f8;
  cmAlphaNum local_2c0;
  cmAlphaNum local_288;
  cmAlphaNum local_250;
  cmAlphaNum local_218;
  cmAlphaNum local_1e0;
  cmAlphaNum local_1a8;
  cmAlphaNum local_170;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_138;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_120;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_108;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  char *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char *b_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a_local;
  
  local_38 = args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (char *)args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b;
  b_local = (char *)a;
  a_local = __return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_170,a);
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const(&)[4],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_138,
             &cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const&[],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
              ::makePair,&local_170);
  cmAlphaNum::cmAlphaNum(&local_1a8,(char)args_local->_M_dataplus);
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const(&)[4],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_120,
             &cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const&[],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
              ::makePair,&local_1a8);
  cmAlphaNum::cmAlphaNum(&local_1e0,(string *)args_local_1);
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const(&)[4],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_108,
             &cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const&[],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
              ::makePair,&local_1e0);
  cmAlphaNum::cmAlphaNum(&local_218,(char)args_local_2->_M_dataplus);
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const(&)[4],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_f0,
             &cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const&[],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
              ::makePair,&local_218);
  cmAlphaNum::cmAlphaNum(&local_250,local_38);
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const(&)[4],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_d8,
             &cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const&[],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
              ::makePair,&local_250);
  cmAlphaNum::cmAlphaNum(&local_288,*args_3);
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const(&)[4],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_c0,
             &cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const&[],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
              ::makePair,&local_288);
  cmAlphaNum::cmAlphaNum(&local_2c0,*args_4);
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const(&)[4],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const&[],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
              ::makePair,&local_2c0);
  cmAlphaNum::cmAlphaNum(&local_2f8,*args_5);
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const(&)[4],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const&[],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
              ::makePair,&local_2f8);
  cmAlphaNum::cmAlphaNum(&local_330,args_6);
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const(&)[4],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const&[],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
              ::makePair,&local_330);
  cmAlphaNum::cmAlphaNum(&local_368,args_7);
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const(&)[4],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[4],int,char,std::__cxx11::string_const&,std::__cxx11::string&>(std::__cxx11::string_const&,char&&,std::__cxx11::string&&,char&&,std::__cxx11::string_const&,char_const&[],int&&,char&&,std::__cxx11::string_const&,std::__cxx11::string&)
              ::makePair,&local_368);
  local_48 = &local_138;
  local_40 = 10;
  views._M_len = 10;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}